

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

bool __thiscall DIntermissionScreen::CheckOverlay(DIntermissionScreen *this,int i)

{
  int iVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  bool bVar6;
  FName local_14;
  
  iVar1 = (this->mOverlays).Array[i].mCondition.Index;
  if (iVar1 == 0) {
LAB_0030097b:
    bVar6 = true;
  }
  else {
    if ((iVar1 != 0x236) || (multiplayer)) {
      if (multiplayer) {
        return false;
      }
      if (players == (undefined8 *)0x0) {
        return false;
      }
      pPVar3 = PClass::FindClass(&local_14);
      puVar2 = players;
      if (pPVar3 != (PClass *)0x0) {
        if (players[1] == 0) {
          uVar4 = (**(code **)*players)(players);
          puVar2[1] = uVar4;
        }
        pPVar5 = (PClass *)puVar2[1];
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (bVar6) goto LAB_0030097b;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool DIntermissionScreen::CheckOverlay(int i)
{
	if (mOverlays[i].mCondition == NAME_Multiplayer && !multiplayer) return false;
	else if (mOverlays[i].mCondition != NAME_None)
	{
		if (multiplayer || players[0].mo == NULL) return false;
		const PClass *cls = PClass::FindClass(mOverlays[i].mCondition);
		if (cls == NULL) return false;
		if (!players[0].mo->IsKindOf(cls)) return false;
	}
	return true;
}